

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>
wabt::WastLexer::CreateBufferLexer(string_view filename,void *data,size_t size)

{
  __uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true> in_RDI;
  wabt local_40 [8];
  unsigned_long local_38;
  void *local_30;
  string_view local_28;
  
  MakeUnique<wabt::LexerSource,void_const*&,unsigned_long&>(local_40,&local_30,&local_38);
  MakeUnique<wabt::WastLexer,std::unique_ptr<wabt::LexerSource,std::default_delete<wabt::LexerSource>>,wabt::string_view&>
            ((wabt *)in_RDI.
                     super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>
                     .super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl,
             (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)local_40,
             &local_28);
  std::unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>::~unique_ptr
            ((unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)local_40);
  return (__uniq_ptr_data<wabt::WastLexer,_std::default_delete<wabt::WastLexer>,_true,_true>)
         (tuple<wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>)
         in_RDI.super___uniq_ptr_impl<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>._M_t.
         super__Tuple_impl<0UL,_wabt::WastLexer_*,_std::default_delete<wabt::WastLexer>_>.
         super__Head_base<0UL,_wabt::WastLexer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<WastLexer> WastLexer::CreateBufferLexer(string_view filename,
                                                        const void* data,
                                                        size_t size) {
  return MakeUnique<WastLexer>(MakeUnique<LexerSource>(data, size), filename);
}